

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O0

bool __thiscall
capnp::_::StructReader::getDataField<bool>(StructReader *this,StructDataOffset offset)

{
  byte bVar1;
  uint uVar2;
  byte *b;
  uint boffset;
  StructDataOffset offset_local;
  StructReader *this_local;
  
  if (offset < this->dataSize) {
    bVar1 = *(byte *)((long)this->data + (ulong)(offset >> 3));
    uVar2 = unbound<unsigned_int>(1 << ((byte)offset & 7));
    this_local._7_1_ = (bVar1 & uVar2) != 0;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool StructReader::getDataField<bool>(StructDataOffset offset) const {
  auto boffset = offset * (ONE * BITS / ELEMENTS);
  if (boffset < dataSize) {
    const byte* b = reinterpret_cast<const byte*>(data) + boffset / BITS_PER_BYTE;
    return (*reinterpret_cast<const uint8_t*>(b) &
        unbound(ONE << (boffset % BITS_PER_BYTE / BITS))) != 0;
  } else {
    return false;
  }
}